

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void * nk_buffer_alloc(nk_buffer *b,nk_buffer_allocation_type type,nk_size size,nk_size align)

{
  nk_plugin_alloc p_Var1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  nk_size back_size;
  nk_size nVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  float fVar11;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1f75,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1f76,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  b->needed = b->needed + size;
  pvVar3 = (b->memory).ptr;
  if (type == NK_BUFFER_FRONT) {
    uVar4 = b->allocated;
    pvVar8 = (void *)((long)pvVar3 + uVar4);
    pvVar10 = (void *)(-align & (long)pvVar8 + (align - 1));
    lVar9 = (long)pvVar10 - (long)pvVar8;
    if (align == 0) {
      lVar9 = 0;
      pvVar10 = pvVar8;
    }
    if (b->size < uVar4 + size + lVar9) goto LAB_0011daef;
  }
  else {
    uVar6 = b->size;
    pvVar8 = (void *)((uVar6 - size) + (long)pvVar3);
    if (type == NK_BUFFER_BACK) {
      if (align == 0) {
LAB_0011dad0:
        lVar9 = 0;
        pvVar10 = pvVar8;
      }
      else {
        lVar9 = (long)pvVar8 - (long)(-align & (ulong)pvVar8);
        pvVar10 = (void *)(-align & (ulong)pvVar8);
      }
    }
    else {
      if (align == 0) goto LAB_0011dad0;
      pvVar10 = (void *)(-align & (long)pvVar8 + (align - 1));
      lVar9 = (long)pvVar10 - (long)pvVar8;
    }
    uVar5 = 0;
    if (lVar9 + size <= uVar6) {
      uVar5 = uVar6 - (lVar9 + size);
    }
    uVar4 = b->allocated;
    if (uVar4 < uVar5) goto LAB_0011dc5e;
LAB_0011daef:
    if (b->type != NK_BUFFER_DYNAMIC) {
      return (void *)0x0;
    }
    p_Var1 = (b->pool).alloc;
    if ((p_Var1 == (nk_plugin_alloc)0x0) || ((b->pool).free == (nk_plugin_free)0x0)) {
      __assert_fail("b->pool.alloc && b->pool.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x1f89,
                    "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                   );
    }
    nVar7 = (b->memory).size;
    fVar11 = (float)nVar7 * b->grow_factor;
    uVar6 = (ulong)fVar11;
    uVar6 = (long)(fVar11 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
    uVar2 = ((int)uVar4 + (int)size) - 1;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar4 = (ulong)((uVar2 >> 0x10 | uVar2) + 1);
    if (uVar6 <= uVar4) {
      uVar6 = uVar4;
    }
    pvVar3 = (*p_Var1)((b->pool).userdata,pvVar3,uVar6);
    if (pvVar3 == (void *)0x0) {
      __assert_fail("temp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x1f53,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
    }
    (b->memory).size = uVar6;
    pvVar8 = (b->memory).ptr;
    if (pvVar3 != pvVar8) {
      nk_memcopy(pvVar3,pvVar8,nVar7);
      (*(b->pool).free)((b->pool).userdata,(b->memory).ptr);
    }
    nVar7 = nVar7 - b->size;
    if (nVar7 != 0) {
      uVar6 = uVar6 - nVar7;
      nk_memcopy((void *)((long)pvVar3 + uVar6),(void *)(b->size + (long)pvVar3),nVar7);
    }
    b->size = uVar6;
    (b->memory).ptr = pvVar3;
    if (type != NK_BUFFER_FRONT) {
      pvVar3 = (void *)((long)pvVar3 + (uVar6 - size));
      if (type == NK_BUFFER_BACK) {
        if (align == 0) {
LAB_0011dc5c:
          lVar9 = 0;
          pvVar10 = pvVar3;
        }
        else {
          pvVar10 = (void *)(-align & (ulong)pvVar3);
          lVar9 = (long)pvVar3 - (long)pvVar10;
        }
      }
      else {
        if (align == 0) goto LAB_0011dc5c;
        pvVar10 = (void *)(-align & (long)pvVar3 + (align - 1));
        lVar9 = (long)pvVar10 - (long)pvVar3;
      }
LAB_0011dc5e:
      b->size = uVar6 - (size + lVar9);
      goto LAB_0011dc76;
    }
    uVar4 = b->allocated;
    pvVar10 = (void *)((long)pvVar3 + uVar4);
    if (align == 0) {
      lVar9 = 0;
    }
    else {
      pvVar3 = (void *)(-align & (long)pvVar10 + (align - 1));
      lVar9 = (long)pvVar3 - (long)pvVar10;
      pvVar10 = pvVar3;
    }
  }
  b->allocated = size + uVar4 + lVar9;
LAB_0011dc76:
  b->needed = lVar9 + b->needed;
  b->calls = b->calls + 1;
  return pvVar10;
}

Assistant:

NK_LIB void*
nk_buffer_alloc(struct nk_buffer *b, enum nk_buffer_allocation_type type,
    nk_size size, nk_size align)
{
    int full;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(size);
    if (!b || !size) return 0;
    b->needed += size;

    /* calculate total size with needed alignment + size */
    if (type == NK_BUFFER_FRONT)
        unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
    else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
    memory = nk_buffer_align(unaligned, align, &alignment, type);

    /* check if buffer has enough memory*/
    if (type == NK_BUFFER_FRONT)
        full = ((b->allocated + size + alignment) > b->size);
    else full = ((b->size - NK_MIN(b->size,(size + alignment))) <= b->allocated);

    if (full) {
        nk_size capacity;
        if (b->type != NK_BUFFER_DYNAMIC)
            return 0;
        NK_ASSERT(b->pool.alloc && b->pool.free);
        if (b->type != NK_BUFFER_DYNAMIC || !b->pool.alloc || !b->pool.free)
            return 0;

        /* buffer is full so allocate bigger buffer if dynamic */
        capacity = (nk_size)((float)b->memory.size * b->grow_factor);
        capacity = NK_MAX(capacity, nk_round_up_pow2((nk_uint)(b->allocated + size)));
        b->memory.ptr = nk_buffer_realloc(b, capacity, &b->memory.size);
        if (!b->memory.ptr) return 0;

        /* align newly allocated pointer */
        if (type == NK_BUFFER_FRONT)
            unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
        else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
        memory = nk_buffer_align(unaligned, align, &alignment, type);
    }
    if (type == NK_BUFFER_FRONT)
        b->allocated += size + alignment;
    else b->size -= (size + alignment);
    b->needed += alignment;
    b->calls++;
    return memory;
}